

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_Login(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_USER_TYPE userType,CK_UTF8CHAR_PTR pPin
                ,CK_ULONG ulPinLen)

{
  bool bVar1;
  Session *this_00;
  Token *pTVar2;
  ByteString *pin_00;
  long in_RCX;
  Token *in_RDX;
  HandleManager *in_RDI;
  Token *token;
  ByteString pin;
  Session *session;
  CK_RV rv;
  size_t in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  ByteString *in_stack_ffffffffffffff50;
  ByteString *in_stack_ffffffffffffff60;
  CK_SESSION_HANDLE in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  SessionManager *in_stack_ffffffffffffff88;
  ByteString *in_stack_ffffffffffffffa0;
  Token *in_stack_ffffffffffffffa8;
  CK_RV local_38;
  CK_RV local_8;
  
  if (((ulong)in_RDI->handlesMutex & 1) == 0) {
    return 400;
  }
  this_00 = (Session *)HandleManager::getSession(in_RDI,in_stack_ffffffffffffff70);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  if (in_RCX == 0) {
    return 7;
  }
  ByteString::ByteString
            (in_stack_ffffffffffffff50,
             (uchar *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40);
  pTVar2 = Session::getToken(this_00);
  if (pTVar2 == (Token *)0x0) {
    local_8 = 5;
    goto LAB_00162ab1;
  }
  if (in_RDX == (Token *)0x0) {
    pin_00 = (ByteString *)Session::getSlot(this_00);
    Slot::getSlotID((Slot *)pin_00);
    bVar1 = SessionManager::haveROSession
                      (in_stack_ffffffffffffff88,
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if (bVar1) {
      local_8 = 0xb7;
      goto LAB_00162ab1;
    }
    local_38 = Token::loginSO(in_RDX,pin_00);
  }
  else if (in_RDX == (Token *)0x1) {
    local_38 = Token::loginUser(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  else {
    if (in_RDX != (Token *)0x2) {
      local_8 = 0x103;
      goto LAB_00162ab1;
    }
    bVar1 = Session::getReAuthentication(this_00);
    if (!bVar1) {
      local_8 = 0x91;
      goto LAB_00162ab1;
    }
    local_38 = Token::reAuthenticate(in_RDX,in_stack_ffffffffffffff60);
    if (local_38 == 0) {
      Session::setReAuthentication(this_00,false);
    }
  }
  local_8 = local_38;
LAB_00162ab1:
  ByteString::~ByteString((ByteString *)0x162abb);
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_Login(CK_SESSION_HANDLE hSession, CK_USER_TYPE userType, CK_UTF8CHAR_PTR pPin, CK_ULONG ulPinLen)
{
	CK_RV rv = CKR_OK;

	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the PIN
	if (pPin == NULL_PTR) return CKR_ARGUMENTS_BAD;
	ByteString pin(pPin, ulPinLen);

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	switch (userType)
	{
		case CKU_SO:
			// There cannot exist a R/O session on this slot
			if (sessionManager->haveROSession(session->getSlot()->getSlotID())) return CKR_SESSION_READ_ONLY_EXISTS;

			// Login
			rv = token->loginSO(pin);
			break;
		case CKU_USER:
			// Login
			rv = token->loginUser(pin);
			break;
		case CKU_CONTEXT_SPECIFIC:
			// Check if re-authentication is required
			if (!session->getReAuthentication()) return CKR_OPERATION_NOT_INITIALIZED;

			// Re-authenticate
			rv = token->reAuthenticate(pin);
			if (rv == CKR_OK) session->setReAuthentication(false);
			break;
		default:
			return CKR_USER_TYPE_INVALID;
	}

	return rv;
}